

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbnf.cpp
# Opt level: O0

int __thiscall icu_63::RuleBasedNumberFormat::init(RuleBasedNumberFormat *this,EVP_PKEY_CTX *ctx)

{
  UnicodeString *pUVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  undefined4 uVar4;
  UBool UVar5;
  char16_t cVar6;
  int32_t iVar7;
  uint start_00;
  int iVar8;
  int extraout_EAX;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  UnicodeString *pUVar9;
  NFRuleSet **ppNVar10;
  ulong uVar11;
  ulong uVar12;
  ulong *puVar13;
  NFRuleSet *pNVar14;
  undefined4 extraout_var_01;
  void *in_RCX;
  LocalizationInfo *in_RDX;
  size_t size;
  UChar *size_00;
  UMemory *this_00;
  undefined8 in_R8;
  NFRuleSet *local_248;
  NFRuleSet *local_220;
  UnicodeString *local_1e8;
  UnicodeString *local_1c0;
  UnicodeString *local_1a0;
  LocalizationInfo *local_168;
  NFRuleSet *rs;
  undefined1 local_148 [8];
  UnicodeString name;
  int local_100;
  int32_t i_2;
  int i_1;
  int local_e0;
  int local_dc;
  int32_t p_1;
  int32_t start;
  int curRuleSet;
  int local_a4;
  int local_a0;
  int i;
  int32_t p;
  uint local_8c;
  int local_88;
  int lpStart;
  int lpEnd;
  int32_t lp;
  undefined1 local_70 [8];
  UnicodeString description;
  UErrorCode *status_local;
  UParseError *pErr_local;
  LocalizationInfo *localizationInfos_local;
  UnicodeString *rules_local;
  RuleBasedNumberFormat *this_local;
  
  description.fUnion._48_8_ = in_R8;
  memset(in_RCX,0,0x48);
  UVar5 = ::U_FAILURE(*(UErrorCode *)description.fUnion._48_8_);
  if (UVar5 != '\0') {
    return (int)CONCAT71(extraout_var,UVar5);
  }
  initializeDecimalFormatSymbols(this,(UErrorCode *)description.fUnion._48_8_);
  initializeDefaultInfinityRule(this,(UErrorCode *)description.fUnion._48_8_);
  initializeDefaultNaNRule(this,(UErrorCode *)description.fUnion._48_8_);
  UVar5 = ::U_FAILURE(*(UErrorCode *)description.fUnion._48_8_);
  if (UVar5 != '\0') {
    return (int)CONCAT71(extraout_var_00,UVar5);
  }
  if (in_RDX == (LocalizationInfo *)0x0) {
    local_168 = (LocalizationInfo *)0x0;
  }
  else {
    local_168 = LocalizationInfo::ref(in_RDX);
  }
  this->localizations = local_168;
  UnicodeString::UnicodeString((UnicodeString *)local_70,(UnicodeString *)ctx);
  iVar7 = UnicodeString::length((UnicodeString *)local_70);
  if (iVar7 == 0) {
    *(undefined4 *)description.fUnion._48_8_ = 7;
  }
  else {
    stripWhitespace(this,(UnicodeString *)local_70);
    start_00 = UnicodeString::indexOf((UnicodeString *)local_70,L"%%lenient-parse:",-1,0);
    if ((start_00 != 0xffffffff) &&
       ((start_00 == 0 ||
        (cVar6 = UnicodeString::charAt((UnicodeString *)local_70,start_00 - 1), cVar6 == L';')))) {
      local_88 = UnicodeString::indexOf((UnicodeString *)local_70,L";%",2,start_00);
      if (local_88 == -1) {
        local_88 = UnicodeString::length((UnicodeString *)local_70);
        local_88 = local_88 + -1;
      }
      iVar7 = u_strlen_63(L"%%lenient-parse:");
      local_8c = start_00 + iVar7;
      while( true ) {
        size = (size_t)local_8c;
        cVar6 = UnicodeString::charAt((UnicodeString *)local_70,local_8c);
        UVar5 = PatternProps::isWhiteSpace((uint)(ushort)cVar6);
        if (UVar5 == '\0') break;
        local_8c = local_8c + 1;
      }
      pUVar9 = (UnicodeString *)UMemory::operator_new((UMemory *)0x40,size);
      local_1a0 = (UnicodeString *)0x0;
      if (pUVar9 != (UnicodeString *)0x0) {
        UnicodeString::UnicodeString(pUVar9);
        local_1a0 = pUVar9;
      }
      this->lenientParseRules = local_1a0;
      if (this->lenientParseRules == (UnicodeString *)0x0) {
        *(undefined4 *)description.fUnion._48_8_ = 7;
        goto LAB_0026eeb5;
      }
      UnicodeString::setTo
                (this->lenientParseRules,(UnicodeString *)local_70,local_8c,local_88 - local_8c);
      UnicodeString::remove((UnicodeString *)local_70,(char *)(ulong)start_00);
    }
    this->numRuleSets = 0;
    size_00 = L";%";
    for (local_a0 = UnicodeString::indexOf((UnicodeString *)local_70,L";%",2,0); local_a0 != -1;
        local_a0 = UnicodeString::indexOf((UnicodeString *)local_70,L";%",2,local_a0 + 1)) {
      this->numRuleSets = this->numRuleSets + 1;
      size_00 = L";%";
    }
    this->numRuleSets = this->numRuleSets + 1;
    ppNVar10 = (NFRuleSet **)uprv_malloc_63((long)this->numRuleSets * 8 + 8);
    this->fRuleSets = ppNVar10;
    if (this->fRuleSets == (NFRuleSet **)0x0) {
      *(undefined4 *)description.fUnion._48_8_ = 7;
    }
    else {
      for (local_a4 = 0; local_a4 <= this->numRuleSets; local_a4 = local_a4 + 1) {
        this->fRuleSets[local_a4] = (NFRuleSet *)0x0;
      }
      if (this->numRuleSets == 0) {
        *(undefined4 *)description.fUnion._48_8_ = 1;
      }
      else {
        uVar11 = (ulong)this->numRuleSets;
        auVar2._8_8_ = 0;
        auVar2._0_8_ = uVar11;
        uVar12 = SUB168(auVar2 * ZEXT816(0x40),0);
        this_00 = (UMemory *)(uVar12 + 8);
        if (SUB168(auVar2 * ZEXT816(0x40),8) != 0 || 0xfffffffffffffff7 < uVar12) {
          this_00 = (UMemory *)0xffffffffffffffff;
        }
        puVar13 = (ulong *)UMemory::operator_new__(this_00,(size_t)size_00);
        local_1c0 = (UnicodeString *)0x0;
        if (puVar13 != (ulong *)0x0) {
          *puVar13 = uVar11;
          local_1c0 = (UnicodeString *)(puVar13 + 1);
          if (uVar11 != 0) {
            local_1e8 = local_1c0;
            do {
              UnicodeString::UnicodeString(local_1e8);
              local_1e8 = local_1e8 + 1;
            } while (local_1e8 != local_1c0 + uVar11);
          }
        }
        this->ruleSetDescriptions = local_1c0;
        if (this->ruleSetDescriptions == (UnicodeString *)0x0) {
          *(undefined4 *)description.fUnion._48_8_ = 7;
        }
        else {
          p_1 = 0;
          local_dc = 0;
          local_e0 = UnicodeString::indexOf((UnicodeString *)local_70,L";%",2,0);
          while (local_e0 != -1) {
            pUVar9 = (UnicodeString *)local_70;
            UnicodeString::setTo
                      (this->ruleSetDescriptions + p_1,pUVar9,local_dc,(local_e0 - local_dc) + 1);
            pNVar14 = (NFRuleSet *)UMemory::operator_new((UMemory *)0xa8,(size_t)pUVar9);
            local_220 = (NFRuleSet *)0x0;
            if (pNVar14 != (NFRuleSet *)0x0) {
              NFRuleSet::NFRuleSet
                        (pNVar14,this,this->ruleSetDescriptions,p_1,
                         (UErrorCode *)description.fUnion._48_8_);
              local_220 = pNVar14;
            }
            this->fRuleSets[p_1] = local_220;
            if (this->fRuleSets[p_1] == (NFRuleSet *)0x0) {
              *(undefined4 *)description.fUnion._48_8_ = 7;
              goto LAB_0026eeb5;
            }
            p_1 = p_1 + 1;
            local_dc = local_e0 + 1;
            local_e0 = UnicodeString::indexOf((UnicodeString *)local_70,L";%",2,local_dc);
          }
          pUVar1 = this->ruleSetDescriptions;
          iVar7 = UnicodeString::length((UnicodeString *)local_70);
          pUVar9 = (UnicodeString *)local_70;
          UnicodeString::setTo(pUVar1 + p_1,pUVar9,local_dc,iVar7 - local_dc);
          pNVar14 = (NFRuleSet *)UMemory::operator_new((UMemory *)0xa8,(size_t)pUVar9);
          local_248 = (NFRuleSet *)0x0;
          if (pNVar14 != (NFRuleSet *)0x0) {
            NFRuleSet::NFRuleSet
                      (pNVar14,this,this->ruleSetDescriptions,p_1,
                       (UErrorCode *)description.fUnion._48_8_);
            local_248 = pNVar14;
          }
          this->fRuleSets[p_1] = local_248;
          if (this->fRuleSets[p_1] == (NFRuleSet *)0x0) {
            *(undefined4 *)description.fUnion._48_8_ = 7;
          }
          else {
            initDefaultRuleSet(this);
            for (local_100 = 0; local_100 < this->numRuleSets; local_100 = local_100 + 1) {
              NFRuleSet::parseRules
                        (this->fRuleSets[local_100],this->ruleSetDescriptions + local_100,
                         (UErrorCode *)description.fUnion._48_8_);
            }
            if (in_RDX == (LocalizationInfo *)0x0) {
              pNVar14 = getDefaultRuleSet(this);
              this->defaultRuleSet = pNVar14;
            }
            else {
              for (name.fUnion._52_4_ = 0; uVar4 = name.fUnion._52_4_,
                  iVar8 = (*in_RDX->_vptr_LocalizationInfo[3])(), (int)uVar4 < iVar8;
                  name.fUnion._52_4_ = name.fUnion._52_4_ + 1) {
                iVar8 = (*in_RDX->_vptr_LocalizationInfo[4])(in_RDX,(ulong)(uint)name.fUnion._52_4_)
                ;
                ConstChar16Ptr::ConstChar16Ptr
                          ((ConstChar16Ptr *)&rs,(char16_t *)CONCAT44(extraout_var_01,iVar8));
                UnicodeString::UnicodeString
                          ((UnicodeString *)local_148,'\x01',(ConstChar16Ptr *)&rs,-1);
                ConstChar16Ptr::~ConstChar16Ptr((ConstChar16Ptr *)&rs);
                pNVar14 = findRuleSet(this,(UnicodeString *)local_148,
                                      (UErrorCode *)description.fUnion._48_8_);
                if (pNVar14 == (NFRuleSet *)0x0) {
                  bVar3 = true;
                }
                else {
                  if (name.fUnion._52_4_ == 0) {
                    this->defaultRuleSet = pNVar14;
                  }
                  bVar3 = false;
                }
                UnicodeString::~UnicodeString((UnicodeString *)local_148);
                if (bVar3) break;
              }
            }
            UnicodeString::operator=(&this->originalDescription,(UnicodeString *)ctx);
          }
        }
      }
    }
  }
LAB_0026eeb5:
  UnicodeString::~UnicodeString((UnicodeString *)local_70);
  return extraout_EAX;
}

Assistant:

void
RuleBasedNumberFormat::init(const UnicodeString& rules, LocalizationInfo* localizationInfos,
                            UParseError& pErr, UErrorCode& status)
{
    // TODO: implement UParseError
    uprv_memset(&pErr, 0, sizeof(UParseError));
    // Note: this can leave ruleSets == NULL, so remaining code should check
    if (U_FAILURE(status)) {
        return;
    }

    initializeDecimalFormatSymbols(status);
    initializeDefaultInfinityRule(status);
    initializeDefaultNaNRule(status);
    if (U_FAILURE(status)) {
        return;
    }

    this->localizations = localizationInfos == NULL ? NULL : localizationInfos->ref();

    UnicodeString description(rules);
    if (!description.length()) {
        status = U_MEMORY_ALLOCATION_ERROR;
        return;
    }

    // start by stripping the trailing whitespace from all the rules
    // (this is all the whitespace follwing each semicolon in the
    // description).  This allows us to look for rule-set boundaries
    // by searching for ";%" without having to worry about whitespace
    // between the ; and the %
    stripWhitespace(description);

    // check to see if there's a set of lenient-parse rules.  If there
    // is, pull them out into our temporary holding place for them,
    // and delete them from the description before the real desciption-
    // parsing code sees them
    int32_t lp = description.indexOf(gLenientParse, -1, 0);
    if (lp != -1) {
        // we've got to make sure we're not in the middle of a rule
        // (where "%%lenient-parse" would actually get treated as
        // rule text)
        if (lp == 0 || description.charAt(lp - 1) == gSemiColon) {
            // locate the beginning and end of the actual collation
            // rules (there may be whitespace between the name and
            // the first token in the description)
            int lpEnd = description.indexOf(gSemiPercent, 2, lp);

            if (lpEnd == -1) {
                lpEnd = description.length() - 1;
            }
            int lpStart = lp + u_strlen(gLenientParse);
            while (PatternProps::isWhiteSpace(description.charAt(lpStart))) {
                ++lpStart;
            }

            // copy out the lenient-parse rules and delete them
            // from the description
            lenientParseRules = new UnicodeString();
            /* test for NULL */
            if (lenientParseRules == nullptr) {
                status = U_MEMORY_ALLOCATION_ERROR;
                return;
            }
            lenientParseRules->setTo(description, lpStart, lpEnd - lpStart);

            description.remove(lp, lpEnd + 1 - lp);
        }
    }

    // pre-flight parsing the description and count the number of
    // rule sets (";%" marks the end of one rule set and the beginning
    // of the next)
    numRuleSets = 0;
    for (int32_t p = description.indexOf(gSemiPercent, 2, 0); p != -1; p = description.indexOf(gSemiPercent, 2, p)) {
        ++numRuleSets;
        ++p;
    }
    ++numRuleSets;

    // our rule list is an array of the appropriate size
    fRuleSets = (NFRuleSet **)uprv_malloc((numRuleSets + 1) * sizeof(NFRuleSet *));
    /* test for NULL */
    if (fRuleSets == 0) {
        status = U_MEMORY_ALLOCATION_ERROR;
        return;
    }

    for (int i = 0; i <= numRuleSets; ++i) {
        fRuleSets[i] = NULL;
    }

    // divide up the descriptions into individual rule-set descriptions
    // and store them in a temporary array.  At each step, we also
    // new up a rule set, but all this does is initialize its name
    // and remove it from its description.  We can't actually parse
    // the rest of the descriptions and finish initializing everything
    // because we have to know the names and locations of all the rule
    // sets before we can actually set everything up
    if(!numRuleSets) {
        status = U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }

    ruleSetDescriptions = new UnicodeString[numRuleSets];
    if (ruleSetDescriptions == nullptr) {
        status = U_MEMORY_ALLOCATION_ERROR;
        return;
    }

    {
        int curRuleSet = 0;
        int32_t start = 0;
        for (int32_t p = description.indexOf(gSemiPercent, 2, 0); p != -1; p = description.indexOf(gSemiPercent, 2, start)) {
            ruleSetDescriptions[curRuleSet].setTo(description, start, p + 1 - start);
            fRuleSets[curRuleSet] = new NFRuleSet(this, ruleSetDescriptions, curRuleSet, status);
            if (fRuleSets[curRuleSet] == nullptr) {
                status = U_MEMORY_ALLOCATION_ERROR;
                return;
            }
            ++curRuleSet;
            start = p + 1;
        }
        ruleSetDescriptions[curRuleSet].setTo(description, start, description.length() - start);
        fRuleSets[curRuleSet] = new NFRuleSet(this, ruleSetDescriptions, curRuleSet, status);
        if (fRuleSets[curRuleSet] == nullptr) {
            status = U_MEMORY_ALLOCATION_ERROR;
            return;
        }
    }

    // now we can take note of the formatter's default rule set, which
    // is the last public rule set in the description (it's the last
    // rather than the first so that a user can create a new formatter
    // from an existing formatter and change its default behavior just
    // by appending more rule sets to the end)

    // {dlf} Initialization of a fraction rule set requires the default rule
    // set to be known.  For purposes of initialization, this is always the 
    // last public rule set, no matter what the localization data says.
    initDefaultRuleSet();

    // finally, we can go back through the temporary descriptions
    // list and finish setting up the substructure (and we throw
    // away the temporary descriptions as we go)
    {
        for (int i = 0; i < numRuleSets; i++) {
            fRuleSets[i]->parseRules(ruleSetDescriptions[i], status);
        }
    }

    // Now that the rules are initialized, the 'real' default rule
    // set can be adjusted by the localization data.

    // The C code keeps the localization array as is, rather than building
    // a separate array of the public rule set names, so we have less work
    // to do here-- but we still need to check the names.
    
    if (localizationInfos) {
        // confirm the names, if any aren't in the rules, that's an error
        // it is ok if the rules contain public rule sets that are not in this list
        for (int32_t i = 0; i < localizationInfos->getNumberOfRuleSets(); ++i) {
            UnicodeString name(TRUE, localizationInfos->getRuleSetName(i), -1);
            NFRuleSet* rs = findRuleSet(name, status);
            if (rs == NULL) {
                break; // error
            }
            if (i == 0) {
                defaultRuleSet = rs;
            }
        }
    } else {
        defaultRuleSet = getDefaultRuleSet();
    }
    originalDescription = rules;
}